

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::MergeFrom
          (GLMClassifier_DoubleArray *this,GLMClassifier_DoubleArray *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/GLMClassifier.pb.cc"
               ,0x114);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->value_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->value_,iVar1 + (this->value_).current_size_);
    memcpy(((this->value_).rep_)->elements + (this->value_).current_size_,
           ((from->value_).rep_)->elements,(long)(from->value_).current_size_ << 3);
    (this->value_).current_size_ = (this->value_).current_size_ + (from->value_).current_size_;
  }
  return;
}

Assistant:

void GLMClassifier_DoubleArray::MergeFrom(const GLMClassifier_DoubleArray& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.GLMClassifier.DoubleArray)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
}